

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<double>_>::Decompose_Cholesky(TPZMatrix<std::complex<double>_> *this)

{
  complex<double> a;
  complex<double> *pcVar1;
  complex<double> *pcVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  undefined8 in_XMM1_Qa;
  char *in_stack_00000008;
  char *in_stack_00000010;
  complex<double> tmp2;
  complex<double> sum_1;
  int64_t k_1;
  int64_t j;
  complex<double> tmp;
  complex<double> sum;
  int64_t k;
  int64_t i;
  int64_t dim;
  complex<double> *in_stack_fffffffffffffe08;
  complex<double> *in_stack_fffffffffffffe10;
  complex<double> *in_stack_fffffffffffffe18;
  complex<double> *in_stack_fffffffffffffe20;
  undefined1 local_198 [8];
  undefined8 local_190;
  undefined8 local_180;
  undefined8 local_170;
  undefined1 local_168 [8];
  undefined8 local_160;
  undefined8 local_150;
  undefined8 local_140;
  undefined8 local_130;
  undefined1 local_128 [8];
  undefined8 local_120;
  undefined8 local_110;
  undefined8 local_100;
  undefined8 local_f0;
  undefined8 local_e0;
  complex<double> local_d8;
  long local_c8;
  complex<double> *local_c0;
  undefined8 local_b0;
  undefined1 local_a8 [8];
  undefined8 local_a0;
  undefined8 local_90;
  undefined1 local_88 [8];
  undefined8 local_80;
  undefined8 local_70;
  undefined8 local_60;
  undefined8 local_50;
  undefined8 local_40;
  complex<double> local_38;
  long local_28;
  complex<double> *local_20;
  long local_18;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_00000010,in_stack_00000008);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar5 != iVar6) {
      Error(in_stack_00000010,in_stack_00000008);
    }
    iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_18 = CONCAT44(extraout_var,iVar4);
    for (local_20 = (complex<double> *)0x0; (long)local_20 < local_18;
        local_20 = (complex<double> *)(local_20->_M_value + 1)) {
      for (local_28 = 0; local_28 < (long)local_20; local_28 = local_28 + 1) {
        in_XMM1_Qa = 0;
        std::complex<double>::complex(&local_38,0.0,0.0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_28);
        local_50 = in_XMM1_Qa;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_28);
        local_70 = in_XMM1_Qa;
        std::conj<double>(in_stack_fffffffffffffe10);
        local_60 = in_XMM1_Qa;
        std::operator*(in_stack_fffffffffffffe08,(complex<double> *)0x12b857f);
        local_40 = in_XMM1_Qa;
        std::complex<double>::operator+=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        pcVar1 = local_20;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
        local_90 = in_XMM1_Qa;
        std::operator-(in_stack_fffffffffffffe08,(complex<double> *)0x12b8605);
        local_80 = in_XMM1_Qa;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,pcVar1,pcVar1,local_88);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
      local_b0 = in_XMM1_Qa;
      std::sqrt<double>(in_stack_fffffffffffffe20);
      local_a0 = in_XMM1_Qa;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_20,local_a8);
      local_c0 = local_20;
      while (local_c0 = (complex<double> *)(local_c0->_M_value + 1), (long)local_c0 < local_18) {
        for (local_c8 = 0; local_c8 < (long)local_20; local_c8 = local_c8 + 1) {
          in_XMM1_Qa = 0;
          std::complex<double>::complex(&local_d8,0.0,0.0);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_c8);
          local_f0 = in_XMM1_Qa;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_c0,local_c8);
          local_110 = in_XMM1_Qa;
          std::conj<double>(in_stack_fffffffffffffe10);
          local_100 = in_XMM1_Qa;
          std::operator*(in_stack_fffffffffffffe08,(complex<double> *)0x12b87b8);
          local_e0 = in_XMM1_Qa;
          std::complex<double>::operator+=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          pcVar2 = local_20;
          pcVar1 = local_c0;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_c0);
          local_130 = in_XMM1_Qa;
          std::operator-(in_stack_fffffffffffffe08,(complex<double> *)0x12b883e);
          local_120 = in_XMM1_Qa;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,pcVar2,pcVar1,local_128);
        }
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
        a._M_value._8_8_ = in_stack_fffffffffffffe20;
        a._M_value._0_8_ = in_stack_fffffffffffffe18;
        local_150 = in_XMM1_Qa;
        local_140 = in_XMM1_Qa;
        bVar3 = IsZero(a);
        if (bVar3) {
          Error(in_stack_00000010,in_stack_00000008);
        }
        in_stack_fffffffffffffe08 = local_20;
        in_stack_fffffffffffffe10 = local_c0;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_c0);
        local_170 = in_XMM1_Qa;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
        local_180 = in_XMM1_Qa;
        std::operator/(in_stack_fffffffffffffe08,(complex<double> *)0x12b898b);
        local_160 = in_XMM1_Qa;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffe08,in_stack_fffffffffffffe10,local_168);
        in_stack_fffffffffffffe18 = local_c0;
        in_stack_fffffffffffffe20 = local_20;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_c0);
        std::conj<double>(in_stack_fffffffffffffe10);
        local_190 = in_XMM1_Qa;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,local_198);
      }
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}